

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniform_scalar_fe_space.h
# Opt level: O3

DofHandler * __thiscall
lf::uscalfe::UniformScalarFESpace<double>::LocGlobMap(UniformScalarFESpace<double> *this)

{
  runtime_error *this_00;
  stringstream ss;
  string local_200;
  string local_1e0;
  string local_1c0;
  long local_1a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_198;
  ostream local_190 [376];
  
  (**(this->super_ScalarFESpace<double>)._vptr_ScalarFESpace)(&local_1a0,this);
  if (local_198 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_198);
  }
  if (local_1a0 != 0) {
    return &(this->dofh_).super_DofHandler;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,"No valid FE space object: no mesh",0x21);
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"Mesh() != nullptr","");
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_200,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed(&local_1e0,&local_200,0x6e,&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"this code should not be reached");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

[[nodiscard]] const lf::assemble::DofHandler &LocGlobMap() const override {
    LF_VERIFY_MSG(Mesh() != nullptr, "No valid FE space object: no mesh");
    return dofh_;
  }